

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void SplitBlock(CPpmd7 *p,void *ptr,uint oldIndx,uint newIndx)

{
  uint uVar1;
  void *node;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  CPpmd7 *in_RDI;
  uint k;
  uint nu;
  uint i;
  uint local_1c;
  
  uVar1 = (uint)in_RDI->Indx2Units[in_EDX] - (uint)in_RDI->Indx2Units[in_ECX];
  node = (void *)(in_RSI + (ulong)((uint)in_RDI->Indx2Units[in_ECX] * 0xc));
  local_1c = (uint)in_RDI->Units2Indx[uVar1 - 1];
  if (in_RDI->Indx2Units[local_1c] != uVar1) {
    local_1c = local_1c - 1;
    InsertNode(in_RDI,(void *)((long)node + (ulong)((uint)in_RDI->Indx2Units[local_1c] * 0xc)),
               (uVar1 - in_RDI->Indx2Units[local_1c]) - 1);
  }
  InsertNode(in_RDI,node,local_1c);
  return;
}

Assistant:

static void SplitBlock(CPpmd7 *p, void *ptr, unsigned oldIndx, unsigned newIndx)
{
  unsigned i, nu = I2U(oldIndx) - I2U(newIndx);
  ptr = (Byte *)ptr + U2B(I2U(newIndx));
  if (I2U(i = U2I(nu)) != nu)
  {
    unsigned k = I2U(--i);
    InsertNode(p, ((Byte *)ptr) + U2B(k), nu - k - 1);
  }
  InsertNode(p, ptr, i);
}